

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O2

bool __thiscall ON_Brep::SetVertexTolerance(ON_Brep *this,ON_BrepVertex *vertex,bool bLazySet)

{
  ON_3dPoint *this_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ON_Curve *pOVar6;
  double *pdVar7;
  ON_Surface *this_01;
  ON_BrepEdge *this_02;
  int iVar8;
  int i;
  ulong uVar9;
  ON_BrepTrim *pOVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  ON_Interval local_68;
  ON_Interval local_58;
  ON_3dPoint local_48;
  
  dVar13 = vertex->m_tolerance;
  if (dVar13 < 0.0 || !bLazySet) {
    lVar4 = (long)(vertex->m_ei).m_count;
    if (lVar4 < 1) {
      vertex->m_tolerance = 0.0;
      dVar13 = 0.0;
    }
    else {
      vertex->m_tolerance = -1.23432101234321e+308;
      ON_Interval::ON_Interval(&local_68);
      iVar1 = vertex->m_vertex_index;
      this_00 = &(vertex->super_ON_Point).point;
      dVar13 = 0.0;
      for (lVar11 = 0; lVar11 != lVar4; lVar11 = lVar11 + 1) {
        lVar5 = (long)(vertex->m_ei).m_a[lVar11];
        if (lVar5 < 0) {
          return false;
        }
        this_02 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a
                  + lVar5;
        dVar12 = dVar13;
        pOVar6 = ON_CurveProxy::ProxyCurve(&this_02->super_ON_CurveProxy);
        if (pOVar6 == (ON_Curve *)0x0) {
          return false;
        }
        (*(this_02->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x25])(this_02);
        local_68.m_t[1] = dVar12;
        for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
          if (this_02->m_vi[lVar5] == iVar1) {
            pdVar7 = ON_Interval::operator[](&local_68,(int)lVar5);
            ON_Curve::PointAt(&local_48,(ON_Curve *)this_02,*pdVar7);
            dVar12 = ON_3dPoint::DistanceTo(this_00,&local_48);
            if (dVar13 < dVar12) {
              dVar13 = dVar12;
            }
          }
        }
        uVar2 = (this_02->m_ti).m_count;
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
          uVar3 = (this_02->m_ti).m_a[uVar9];
          pOVar10 = (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                    m_a;
          if (pOVar10 != (ON_BrepTrim *)0x0 &&
              ((int)uVar3 <
               (this->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
               m_count && -1 < (int)uVar3)) {
            pOVar10 = pOVar10 + uVar3;
            pOVar6 = ON_BrepTrim::TrimCurveOf(pOVar10);
            if ((pOVar6 != (ON_Curve *)0x0) &&
               (this_01 = ON_BrepTrim::SurfaceOf(pOVar10), this_01 != (ON_Surface *)0x0)) {
              iVar8 = 1;
              for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
                if (this_02->m_vi[lVar5] == iVar1) {
                  dVar12 = dVar13;
                  (*(pOVar10->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
                    _vptr_ON_Object[0x25])(pOVar10);
                  i = (int)lVar5;
                  if (pOVar10->m_bRev3d != false) {
                    i = iVar8;
                  }
                  local_58.m_t[1] = dVar12;
                  pdVar7 = ON_Interval::operator[](&local_58,i);
                  ON_Curve::PointAt(&local_48,(ON_Curve *)pOVar10,*pdVar7);
                  ON_Surface::PointAt(&local_48,this_01,local_48.x,local_48.y);
                  dVar12 = ON_3dPoint::DistanceTo(this_00,&local_48);
                  if (dVar13 < dVar12) {
                    dVar13 = dVar12;
                  }
                }
                iVar8 = iVar8 + -1;
              }
            }
          }
        }
      }
      dVar13 = (double)(~-(ulong)(dVar13 <= 2.3283064365386963e-10) & (ulong)(dVar13 * 1.001));
      vertex->m_tolerance = dVar13;
    }
  }
  return 0.0 <= dVar13;
}

Assistant:

bool
ON_Brep::SetVertexTolerance( ON_BrepVertex& vertex,
  bool bLazySet // default = false
                // false: recompute tolerance even if
                //        its current value is positive
                // true:  recompute tolerance only if
                //        its current value is nonpositive
  ) const
{
  if ( vertex.m_tolerance < 0.0 || !bLazySet ) {
    const int vertex_edge_count = vertex.EdgeCount();
    if ( vertex_edge_count < 1 ) {
      vertex.m_tolerance = 0.0;
    }
    else {
      vertex.m_tolerance = ON_UNSET_VALUE;
      double tolerance = 0.0;
      double d;
      ON_3dPoint uv;
      ON_Interval edge_domain;
      //const ON_Curve* c=0;
      const ON_Surface* s=0;
      int vei, ei, eti, endi;
      const int vertex_index = vertex.m_vertex_index;
      for ( vei = 0; vei < vertex_edge_count; vei++ ) 
      {
        ei = vertex.m_ei[vei];
        if ( ei < 0 )
          return false;
        const ON_BrepEdge& edge = m_E[ei];
        if ( !edge.ProxyCurve() )
          return false;
        edge_domain = edge.Domain();
        for ( endi = 0; endi < 2; endi++ )
        {
          if ( edge.m_vi[endi] == vertex_index ) 
          {
            d = vertex.point.DistanceTo( edge.PointAt(edge_domain[endi]) );
            if ( tolerance < d )
              tolerance = d;
          }
        }
        const int edge_trim_count = edge.m_ti.Count();
        for ( eti = 0; eti < edge_trim_count; eti++ ) 
        {
          const ON_BrepTrim* trim = Trim(edge.m_ti[eti]);
          if ( 0 == trim )
            continue;
          if ( 0 == trim->TrimCurveOf() )
            continue;
          s = trim->SurfaceOf();
          if ( 0 == s )
            continue;
          for ( endi = 0; endi < 2; endi++ ) {
            if ( edge.m_vi[endi] == vertex_index ) {
              uv = trim->PointAt( trim->Domain()[trim->m_bRev3d?1-endi:endi] );
              d = vertex.point.DistanceTo( s->PointAt(uv.x,uv.y) );
              if ( tolerance < d )
                tolerance = d;
            }
          }
        }
      }
      vertex.m_tolerance = (tolerance <= ON_ZERO_TOLERANCE) ? 0.0 : 1.001*tolerance;
    }
  }
  return (vertex.m_tolerance >= 0.0) ? true : false;
}